

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workspace_pool.cc
# Opt level: O0

void __thiscall
tvm::runtime::WorkspacePool::FreeWorkspace(WorkspacePool *this,TVMContext ctx,void *ptr)

{
  ulong uVar1;
  size_type sVar2;
  reference ppPVar3;
  ostringstream *poVar4;
  ostream *poVar5;
  LogMessageFatal local_1a8;
  void *local_20;
  void *ptr_local;
  WorkspacePool *this_local;
  TVMContext ctx_local;
  
  this_local._4_4_ = ctx.device_id;
  uVar1 = (ulong)this_local._4_4_;
  local_20 = ptr;
  ptr_local = this;
  this_local = (WorkspacePool *)ctx;
  sVar2 = std::
          vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
          ::size(&this->array_);
  if (uVar1 < sVar2) {
    ppPVar3 = std::
              vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
              ::operator[](&this->array_,(long)this_local._4_4_);
    if (*ppPVar3 != (value_type)0x0) goto LAB_001132a0;
  }
  dmlc::LogMessageFatal::LogMessageFatal
            (&local_1a8,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/workspace_pool.cc"
             ,0xa6);
  poVar4 = dmlc::LogMessageFatal::stream_abi_cxx11_(&local_1a8);
  poVar5 = std::operator<<((ostream *)poVar4,
                           "Check failed: static_cast<size_t>(ctx.device_id) < array_.size() && array_[ctx.device_id] != nullptr"
                          );
  std::operator<<(poVar5,": ");
  dmlc::LogMessageFatal::~LogMessageFatal(&local_1a8);
LAB_001132a0:
  ppPVar3 = std::
            vector<tvm::runtime::WorkspacePool::Pool_*,_std::allocator<tvm::runtime::WorkspacePool::Pool_*>_>
            ::operator[](&this->array_,(long)this_local._4_4_);
  Pool::Free(*ppPVar3,local_20);
  return;
}

Assistant:

void WorkspacePool::FreeWorkspace(TVMContext ctx, void *ptr) {
  CHECK(static_cast<size_t>(ctx.device_id) < array_.size() &&
        array_[ctx.device_id] != nullptr);
  array_[ctx.device_id]->Free(ptr);
}